

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

void __thiscall webrtc::Histogram::RemoveOldestEntryAndUpdate(Histogram *this)

{
  long lVar1;
  
  if (0 < this->len_circular_buffer_) {
    if (this->buffer_is_full_ != 0) {
      lVar1 = (long)(this->activity_probability_)._M_t.
                    super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[this->buffer_index_];
      this->bin_count_q10_
      [(this->hist_bin_index_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl[this->buffer_index_]] =
           this->bin_count_q10_
           [(this->hist_bin_index_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
            _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[this->buffer_index_]] - lVar1;
      this->audio_content_q10_ = this->audio_content_q10_ - lVar1;
    }
    return;
  }
  __assert_fail("len_circular_buffer_ > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/histogram.cc"
                ,0x68,"void webrtc::Histogram::RemoveOldestEntryAndUpdate()");
}

Assistant:

void Histogram::RemoveOldestEntryAndUpdate() {
  assert(len_circular_buffer_ > 0);
  // Do nothing if circular buffer is not full.
  if (!buffer_is_full_)
    return;

  int oldest_prob = activity_probability_[buffer_index_];
  int oldest_hist_index = hist_bin_index_[buffer_index_];
  UpdateHist(-oldest_prob, oldest_hist_index);
}